

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_write.cpp
# Opt level: O0

void __thiscall ritobin::io::text_write_impl::TextWriter::write_hex(TextWriter *this,uint32_t hex)

{
  string_view local_50;
  ulong local_40;
  size_t i;
  char acStack_30 [6];
  char result [10];
  char digits [17];
  uint32_t hex_local;
  TextWriter *this_local;
  
  builtin_strncpy(result + 2,"01234567",8);
  stack0xffffffffffffffce = 0x7830;
  result[0] = '\0';
  result[1] = '\0';
  digits._12_4_ = hex;
  for (local_40 = 9; 1 < local_40; local_40 = local_40 - 1) {
    acStack_30[local_40 - 2] = result[(ulong)(digits._12_4_ & 0xf) + 2];
    digits._12_4_ = (uint)digits._12_4_ >> 4;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,(char *)((long)&i + 6),10);
  write_raw(this,local_50);
  return;
}

Assistant:

void write_hex(uint32_t hex) noexcept {
            constexpr char digits[] = "0123456789abcdef";
            char result[10] = { '0', 'x' };
            for (size_t i = 9; i > 1; i--) {
                result[i] = digits[hex & 0x0Fu];
                hex >>= 4;
            }
            write_raw(std::string_view{ result, sizeof(result) });
        }